

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int dotlockUnlock(sqlite3_file *id,int eFileLock)

{
  sqlite3_io_methods *psVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  
  iVar4 = 0;
  if ((uint)*(byte *)((long)&id[3].pMethods + 4) != eFileLock) {
    iVar4 = 0;
    if (eFileLock == 1) {
      *(undefined1 *)((long)&id[3].pMethods + 4) = 1;
    }
    else {
      psVar1 = id[5].pMethods;
      iVar2 = (*aSyscall[0x13].pCurrent)(psVar1);
      if ((iVar2 < 0) &&
         ((piVar3 = __errno_location(), *piVar3 != 0x14 ||
          (iVar2 = (*aSyscall[0x10].pCurrent)(psVar1), iVar2 < 0)))) {
        iVar4 = 0x80a;
        if (*piVar3 == 2) {
          iVar4 = 0;
        }
        else {
          *(int *)&id[4].pMethods = *piVar3;
        }
      }
      else {
        *(undefined1 *)((long)&id[3].pMethods + 4) = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int dotlockUnlock(sqlite3_file *id, int eFileLock) {
  unixFile *pFile = (unixFile*)id;
  char *zLockFile = (char *)pFile->lockingContext;
  int rc;

  assert( pFile );
  OSTRACE(("UNLOCK  %d %d was %d pid=%d (dotlock)\n", pFile->h, eFileLock,
           pFile->eFileLock, getpid()));
  assert( eFileLock<=SHARED_LOCK );
  
  /* no-op if possible */
  if( pFile->eFileLock==eFileLock ){
    return SQLITE_OK;
  }

  /* To downgrade to shared, simply update our internal notion of the
  ** lock state.  No need to mess with the file on disk.
  */
  if( eFileLock==SHARED_LOCK ){
    pFile->eFileLock = SHARED_LOCK;
    return SQLITE_OK;
  }
  
  /* To fully unlock the database, delete the lock file */
  assert( eFileLock==NO_LOCK );
  rc = osRmdir(zLockFile);
  if( rc<0 && errno==ENOTDIR ) rc = osUnlink(zLockFile);
  if( rc<0 ){
    int tErrno = errno;
    rc = 0;
    if( ENOENT != tErrno ){
      rc = SQLITE_IOERR_UNLOCK;
    }
    if( IS_LOCK_ERROR(rc) ){
      pFile->lastErrno = tErrno;
    }
    return rc; 
  }
  pFile->eFileLock = NO_LOCK;
  return SQLITE_OK;
}